

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInNestedExtensions
          (Generator *this,Descriptor *descriptor)

{
  long lVar1;
  long lVar2;
  
  if (0 < *(int *)(descriptor + 0x70)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      FixForeignFieldsInNestedExtensions(this,(Descriptor *)(*(long *)(descriptor + 0x38) + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x88;
    } while (lVar1 < *(int *)(descriptor + 0x70));
  }
  if (0 < *(int *)(descriptor + 0x7c)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      FixForeignFieldsInExtension(this,(FieldDescriptor *)(*(long *)(descriptor + 0x50) + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x48;
    } while (lVar1 < *(int *)(descriptor + 0x7c));
  }
  return;
}

Assistant:

void Generator::FixForeignFieldsInNestedExtensions(
    const Descriptor& descriptor) const {
  // Recursively fix up extensions in all nested types.
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    FixForeignFieldsInNestedExtensions(*descriptor.nested_type(i));
  }
  // Fix up extensions directly contained within this type.
  for (int i = 0; i < descriptor.extension_count(); ++i) {
    FixForeignFieldsInExtension(*descriptor.extension(i));
  }
}